

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

void __thiscall
HighsLinearSumBounds::add(HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  int *piVar1;
  pointer pHVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (this->implVarLowerSource[var] == sum) {
    pdVar3 = this->varLower;
    dVar5 = pdVar3[var];
  }
  else {
    pdVar3 = this->varLower;
    dVar5 = pdVar3[var];
    if (pdVar3[var] <= this->implVarLower[var]) {
      dVar5 = this->implVarLower[var];
    }
  }
  if (this->implVarUpperSource[var] == sum) {
    pdVar4 = this->varUpper;
    dVar6 = pdVar4[var];
  }
  else {
    pdVar4 = this->varUpper;
    dVar6 = pdVar4[var];
    if (this->implVarUpper[var] <= pdVar4[var]) {
      dVar6 = this->implVarUpper[var];
    }
  }
  if (0.0 < coefficient) {
    if (-INFINITY < dVar5) {
      dVar5 = dVar5 * coefficient;
      pHVar2 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar2[sum].hi;
      dVar8 = dVar5 + dVar7;
      pHVar2[sum].hi = dVar8;
      pHVar2[sum].lo =
           (dVar7 - (dVar8 - dVar5)) + (dVar5 - (dVar8 - (dVar8 - dVar5))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (dVar6 < INFINITY) {
      dVar6 = dVar6 * coefficient;
      pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar5 = pHVar2[sum].hi;
      dVar7 = dVar6 + dVar5;
      pHVar2[sum].hi = dVar7;
      pHVar2[sum].lo =
           (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (-INFINITY < pdVar3[var]) {
      dVar6 = pdVar3[var] * coefficient;
      pHVar2 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar5 = pHVar2[sum].hi;
      dVar7 = dVar6 + dVar5;
      pHVar2[sum].hi = dVar7;
      pHVar2[sum].lo =
           (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (INFINITY <= pdVar4[var]) {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
      return;
    }
    dVar6 = pdVar4[var] * coefficient;
    pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar5 = pHVar2[sum].hi;
    dVar7 = dVar6 + dVar5;
    pHVar2[sum].hi = dVar7;
    pHVar2[sum].lo =
         (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar2[sum].lo;
    return;
  }
  if (dVar6 < INFINITY) {
    dVar6 = dVar6 * coefficient;
    pHVar2 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = pHVar2[sum].hi;
    dVar8 = dVar6 + dVar7;
    pHVar2[sum].hi = dVar8;
    pHVar2[sum].lo =
         (dVar7 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + pHVar2[sum].lo;
  }
  else {
    piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
  }
  if (-INFINITY < dVar5) {
    dVar5 = dVar5 * coefficient;
    pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar6 = pHVar2[sum].hi;
    dVar7 = dVar5 + dVar6;
    pHVar2[sum].hi = dVar7;
    pHVar2[sum].lo =
         (dVar6 - (dVar7 - dVar5)) + (dVar5 - (dVar7 - (dVar7 - dVar5))) + pHVar2[sum].lo;
  }
  else {
    piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
  }
  if (pdVar4[var] < INFINITY) {
    dVar6 = pdVar4[var] * coefficient;
    pHVar2 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar5 = pHVar2[sum].hi;
    dVar7 = dVar6 + dVar5;
    pHVar2[sum].hi = dVar7;
    pHVar2[sum].lo =
         (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar2[sum].lo;
  }
  else {
    piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
  }
  if (pdVar3[var] <= -INFINITY) {
    piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
    return;
  }
  dVar6 = pdVar3[var] * coefficient;
  pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = pHVar2[sum].hi;
  dVar7 = dVar6 + dVar5;
  pHVar2[sum].hi = dVar7;
  pHVar2[sum].lo = (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar2[sum].lo;
  return;
}

Assistant:

void HighsLinearSumBounds::add(HighsInt sum, HighsInt var, double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}